

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyDataSPKM::GetKeyOrigin(LegacyDataSPKM *this,CKeyID *keyID,KeyOriginInfo *info)

{
  const_iterator cVar1;
  _Rb_tree_header *p_Var2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock34;
  CKeyMetadata meta;
  unique_lock<std::recursive_mutex> uStack_a8;
  CKeyMetadata local_98;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CKeyMetadata::CKeyMetadata(&local_98);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_a8,
             &(this->super_FillableSigningProvider).cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x40c,false);
  cVar1 = std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_wallet::CKeyMetadata>,_std::_Select1st<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
          ::find(&(this->mapKeyMetadata)._M_t,keyID);
  p_Var2 = &(this->mapKeyMetadata)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar1._M_node == p_Var2) {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_a8);
  }
  else {
    CKeyMetadata::operator=(&local_98,(CKeyMetadata *)&cVar1._M_node[1]._M_right);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_a8);
    if (local_98.has_key_origin == true) {
      *&info->fingerprint = local_98.key_origin.fingerprint;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&info->path,&local_98.key_origin.path);
    }
    else {
      *(undefined4 *)info->fingerprint =
           *(undefined4 *)(keyID->super_uint160).super_base_blob<160U>.m_data._M_elems;
    }
  }
  CKeyMetadata::~CKeyMetadata(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (_Rb_tree_header *)cVar1._M_node != p_Var2;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::GetKeyOrigin(const CKeyID& keyID, KeyOriginInfo& info) const
{
    CKeyMetadata meta;
    {
        LOCK(cs_KeyStore);
        auto it = mapKeyMetadata.find(keyID);
        if (it == mapKeyMetadata.end()) {
            return false;
        }
        meta = it->second;
    }
    if (meta.has_key_origin) {
        std::copy(meta.key_origin.fingerprint, meta.key_origin.fingerprint + 4, info.fingerprint);
        info.path = meta.key_origin.path;
    } else { // Single pubkeys get the master fingerprint of themselves
        std::copy(keyID.begin(), keyID.begin() + 4, info.fingerprint);
    }
    return true;
}